

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_tools.cxx
# Opt level: O0

void __thiscall db_packer::process_file(db_packer *this,string *path)

{
  xr_writer *pxVar1;
  int iVar2;
  xr_reader *pxVar3;
  undefined4 extraout_var;
  void *pvVar4;
  db_file *this_00;
  db_file *local_78;
  db_file *file;
  size_t sStack_68;
  uint32_t crc;
  size_t size;
  size_t offset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  xr_reader *local_28;
  xr_reader *r;
  xr_file_system *fs;
  string *path_local;
  db_packer *this_local;
  
  fs = (xr_file_system *)path;
  path_local = (string *)this;
  pxVar3 = (xr_reader *)xray_re::xr_file_system::instance();
  r = pxVar3;
  std::operator+(&local_48,&this->m_root,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fs);
  pxVar3 = xray_re::xr_file_system::r_open((xr_file_system *)pxVar3,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (pxVar3 != (xr_reader *)0x0) {
    local_28 = pxVar3;
    iVar2 = (*this->m_archive->_vptr_xr_writer[4])();
    size = CONCAT44(extraout_var,iVar2);
    sStack_68 = xray_re::xr_reader::size(local_28);
    pvVar4 = xray_re::xr_reader::data(local_28);
    file._4_4_ = crc32(pvVar4,sStack_68);
    pxVar1 = this->m_archive;
    pvVar4 = xray_re::xr_reader::data(local_28);
    (*pxVar1->_vptr_xr_writer[2])(pxVar1,pvVar4,sStack_68);
    xray_re::xr_file_system::r_close((xr_file_system *)r,&local_28);
    this_00 = (db_file *)operator_new(0x40);
    db_tools::db_file::db_file(this_00);
    local_78 = this_00;
    std::__cxx11::string::operator=((string *)this_00,(string *)fs);
    local_78->crc = file._4_4_;
    local_78->offset = size;
    local_78->size_real = sStack_68;
    local_78->size_compressed = sStack_68;
    std::vector<db_tools::db_file_*,_std::allocator<db_tools::db_file_*>_>::push_back
              (&this->m_files,&local_78);
  }
  return;
}

Assistant:

void db_packer::process_file(const std::string& path)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(m_root + path);
	if (r) {
		size_t offset = m_archive->tell(), size = r->size();
		uint32_t crc = crc32(r->data(), size);
		m_archive->w_raw(r->data(), size);
		fs.r_close(r);

		db_file* file = new db_file;
		file->path = path;
		file->crc = crc;
		file->offset = offset;
		file->size_real = size;
		file->size_compressed = size;
		m_files.push_back(file);
	}
}